

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppmlnn.cpp
# Opt level: O2

MatrixXd * __thiscall
CppMLNN::normalize_examples(MatrixXd *__return_storage_ptr__,CppMLNN *this,MatrixXd *examples)

{
  ostream *poVar1;
  double local_48;
  type local_40;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"normalize_examples");
  std::endl<char,std::char_traits<char>>(poVar1);
  local_48 = 255.0;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator/
            (&local_40,(MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)examples,&local_48);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd CppMLNN::normalize_examples(const MatrixXd& examples) {
	cout << __FUNCTION__ << endl;
	return examples / 255.0;
}